

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigTable.c
# Opt level: O3

Aig_Obj_t * Aig_TableLookup(Aig_Man_t *p,Aig_Obj_t *pGhost)

{
  int iVar1;
  int iVar2;
  Aig_Obj_t *pAVar3;
  Aig_Obj_t *pAVar4;
  Aig_Obj_t *pAVar5;
  uint uVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  uint uVar10;
  ulong uVar11;
  
  if (((ulong)pGhost & 1) != 0) {
    __assert_fail("!Aig_IsComplement(pGhost)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/aig/aigTable.c"
                  ,0x77,"Aig_Obj_t *Aig_TableLookup(Aig_Man_t *, Aig_Obj_t *)");
  }
  uVar6 = (uint)*(undefined8 *)&pGhost->field_0x18;
  uVar10 = uVar6 & 7;
  if (0xfffffffd < uVar10 - 7) {
    pAVar3 = pGhost->pFanin0;
    if ((pAVar3 == (Aig_Obj_t *)0x0) || (pAVar4 = pGhost->pFanin1, pAVar4 == (Aig_Obj_t *)0x0)) {
      __assert_fail("Aig_ObjChild0(pGhost) && Aig_ObjChild1(pGhost)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/aig/aigTable.c"
                    ,0x79,"Aig_Obj_t *Aig_TableLookup(Aig_Man_t *, Aig_Obj_t *)");
    }
    iVar1 = *(int *)(((ulong)pAVar3 & 0xfffffffffffffffe) + 0x24);
    iVar2 = *(int *)(((ulong)pAVar4 & 0xfffffffffffffffe) + 0x24);
    if (iVar2 <= iVar1) {
      __assert_fail("Aig_ObjFanin0(pGhost)->Id < Aig_ObjFanin1(pGhost)->Id",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/aig/aigTable.c"
                    ,0x7a,"Aig_Obj_t *Aig_TableLookup(Aig_Man_t *, Aig_Obj_t *)");
    }
    if (((p->pTable != (Aig_Obj_t **)0x0) &&
        ((*(uint *)(((ulong)pAVar3 & 0xfffffffffffffffe) + 0x18) & 0xffffffc0) != 0)) &&
       ((*(uint *)(((ulong)pAVar4 & 0xfffffffffffffffe) + 0x18) & 0xffffffc0) != 0)) {
      uVar8 = 0;
      uVar9 = 0x6a3;
      if ((uVar6 & 7) != 6) {
        uVar9 = uVar8;
      }
      uVar11 = 0x38f;
      if (((ulong)pAVar3 & 1) == 0) {
        uVar11 = uVar8;
      }
      uVar7 = 0x161;
      if (((ulong)pAVar4 & 1) == 0) {
        uVar7 = uVar8;
      }
      for (pAVar5 = p->pTable[(uVar7 ^ uVar11 ^ uVar9 ^ (long)iVar1 * 0x1f01 ^ (long)iVar2 * 0xb9b)
                              % (ulong)(long)p->nTableSize]; pAVar5 != (Aig_Obj_t *)0x0;
          pAVar5 = (pAVar5->field_0).pNext) {
        if (((pAVar5->pFanin0 == pAVar3) && (pAVar5->pFanin1 == pAVar4)) &&
           ((*(uint *)&pAVar5->field_0x18 & 7) == uVar10)) {
          return pAVar5;
        }
      }
    }
    return (Aig_Obj_t *)0x0;
  }
  __assert_fail("Aig_ObjIsNode(pGhost)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/aig/aigTable.c"
                ,0x78,"Aig_Obj_t *Aig_TableLookup(Aig_Man_t *, Aig_Obj_t *)");
}

Assistant:

Aig_Obj_t * Aig_TableLookup( Aig_Man_t * p, Aig_Obj_t * pGhost )
{
    Aig_Obj_t * pEntry;
    assert( !Aig_IsComplement(pGhost) );
    assert( Aig_ObjIsNode(pGhost) );
    assert( Aig_ObjChild0(pGhost) && Aig_ObjChild1(pGhost) );
    assert( Aig_ObjFanin0(pGhost)->Id < Aig_ObjFanin1(pGhost)->Id );
    if ( p->pTable == NULL || !Aig_ObjRefs(Aig_ObjFanin0(pGhost)) || !Aig_ObjRefs(Aig_ObjFanin1(pGhost)) )
        return NULL;
    for ( pEntry = p->pTable[Aig_Hash(pGhost, p->nTableSize)]; pEntry; pEntry = pEntry->pNext )
    {
        if ( Aig_ObjChild0(pEntry) == Aig_ObjChild0(pGhost) && 
             Aig_ObjChild1(pEntry) == Aig_ObjChild1(pGhost) && 
             Aig_ObjType(pEntry) == Aig_ObjType(pGhost) )
            return pEntry;
    }
    return NULL;
}